

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoLinear> *this,TPZGeoBlend<pzgeom::TPZGeoLinear> *cp)

{
  int64_t iVar1;
  long lVar2;
  
  (this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable
  ._vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_01893200;
  iVar1 = (cp->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[1];
  (this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[0] =
       (cp->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[0];
  (this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes[1] = iVar1;
  (this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable
  ._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_0188ed08;
  lVar2 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar2) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar2) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar2) = 0xffffffffffffffff;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x30);
  TPZTransform<double>::TPZTransform((TPZTransform<double> *)&this->field_0x50);
  TPZTransform<double>::TPZTransform((TPZTransform<double> *)&this->field_0x1f0);
  this->fNeighbours[0].fGeoElIndex = cp->fNeighbours[0].fGeoElIndex;
  this->fNeighbours[0].fSide = cp->fNeighbours[0].fSide;
  TPZTransform<double>::operator=
            ((TPZTransform<double> *)&this->field_0x50,(TPZTransform<double> *)&cp->field_0x50);
  this->fNeighbours[1].fGeoElIndex = cp->fNeighbours[1].fGeoElIndex;
  this->fNeighbours[1].fSide = cp->fNeighbours[1].fSide;
  TPZTransform<double>::operator=
            ((TPZTransform<double> *)&this->field_0x1f0,(TPZTransform<double> *)&cp->field_0x1f0);
  this->fGeoEl = (TPZGeoEl *)0x0;
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.h",
             0x3f);
}

Assistant:

TPZGeoBlend(const TPZGeoBlend &cp) : TPZRegisterClassId(&TPZGeoBlend::ClassId), TGeo(cp) {
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fNeighbours[is] =  cp.fNeighbours[is];
                fTrans[is] =  cp.fTrans[is];
            }
            fGeoEl = 0;
            DebugStop();
        }